

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool __thiscall
slang::ast::Bitstream::canBeTarget
          (Bitstream *this,StreamingConcatenationExpression *lhs,Expression *rhs,
          SourceRange assignmentRange,ASTContext *context)

{
  ulong arg;
  bool bVar1;
  Diagnostic *pDVar2;
  Diagnostic *pDVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  SourceRange range;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  unsigned_long local_90;
  SourceRange *with;
  SourceRange *dynamic;
  string local_70;
  string local_50;
  
  SVar5 = assignmentRange.endLoc;
  sourceRange.endLoc = assignmentRange.startLoc;
  if ((lhs->super_Expression).kind != Streaming) {
    SVar4 = SVar5;
    bVar1 = Type::isBitstreamType((lhs->super_Expression).type.ptr,false);
    if (!bVar1) {
      sourceRange.startLoc = (SourceLocation)rhs;
      pDVar2 = ASTContext::addDiag((ASTContext *)SVar5,(DiagCode)0x2e0007,sourceRange);
      pDVar2 = ast::operator<<(pDVar2,(lhs->super_Expression).type.ptr);
      SVar5 = *(SourceLocation *)(this + 0x20);
      SVar4 = *(SourceLocation *)(this + 0x28);
      goto LAB_0029bd78;
    }
    sourceRange_01.endLoc = SVar4;
    sourceRange_01.startLoc = (lhs->super_Expression).sourceRange.endLoc;
    bVar1 = checkClassAccess((Bitstream *)(lhs->super_Expression).type.ptr,(Type *)SVar5,
                             (ASTContext *)(lhs->super_Expression).sourceRange.startLoc,
                             sourceRange_01);
    if (!bVar1) {
      return false;
    }
  }
  dynamic = (SourceRange *)0x0;
  with = (SourceRange *)0x0;
  bVar1 = withAfterDynamic((StreamingConcatenationExpression *)this,&dynamic,&with);
  if (bVar1) {
    pDVar2 = ASTContext::addDiag((ASTContext *)SVar5,(DiagCode)0x300007,*with);
    SVar5 = dynamic->startLoc;
    SVar4 = dynamic->endLoc;
  }
  else {
    if ((*(byte *)((long)SVar5 + 0x10) & 2) != 0) {
      return true;
    }
    arg = *(ulong *)(this + 0x48);
    if ((lhs->super_Expression).kind == Streaming) {
      local_90 = lhs->bitstreamWidth;
      bVar1 = StreamingConcatenationExpression::isFixedSize
                        ((StreamingConcatenationExpression *)this);
      if ((bVar1) && (bVar1 = StreamingConcatenationExpression::isFixedSize(lhs), bVar1)) {
        if (arg == local_90) {
          return true;
        }
      }
      else {
        bVar1 = dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
                          ((StreamingConcatenationExpression *)this,lhs);
        if (bVar1) {
          return true;
        }
      }
    }
    else {
      bVar1 = Type::isFixedSize((lhs->super_Expression).type.ptr);
      if (!bVar1) {
        return true;
      }
      local_90 = Type::getBitstreamWidth((lhs->super_Expression).type.ptr);
      if (arg <= local_90) {
        return true;
      }
    }
    sourceRange_00.endLoc = sourceRange.endLoc;
    sourceRange_00.startLoc = (SourceLocation)rhs;
    pDVar2 = ASTContext::addDiag((ASTContext *)SVar5,(DiagCode)0x2c0007,sourceRange_00);
    if ((lhs->super_Expression).kind == Streaming) {
      formatWidth<slang::ast::StreamingConcatenationExpression>
                (&local_50,(StreamingConcatenationExpression *)this,DestFill);
      pDVar3 = Diagnostic::operator<<(pDVar2,&local_50);
      formatWidth<slang::ast::StreamingConcatenationExpression>(&local_70,lhs,Source);
      Diagnostic::operator<<(pDVar3,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      pDVar3 = Diagnostic::operator<<<unsigned_long>(pDVar2,arg);
      Diagnostic::operator<<<unsigned_long>(pDVar3,local_90);
    }
    Diagnostic::operator<<(pDVar2,*(SourceRange *)(this + 0x20));
    if ((lhs->super_Expression).kind != Streaming) {
      return false;
    }
    SVar5 = (lhs->super_Expression).sourceRange.startLoc;
    SVar4 = (lhs->super_Expression).sourceRange.endLoc;
  }
LAB_0029bd78:
  range.endLoc = SVar4;
  range.startLoc = SVar5;
  Diagnostic::operator<<(pDVar2,range);
  return false;
}

Assistant:

bool Bitstream::canBeTarget(const StreamingConcatenationExpression& lhs, const Expression& rhs,
                            SourceRange assignmentRange, const ASTContext& context) {
    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isBitstreamType()) {
            context.addDiag(diag::BadStreamSourceType, assignmentRange)
                << *rhs.type << lhs.sourceRange;
            return false;
        }

        if (!checkClassAccess(*rhs.type, context, rhs.sourceRange))
            return false;
    }

    const SourceRange *dynamic = nullptr, *with = nullptr;
    if (withAfterDynamic(lhs, dynamic, with)) {
        context.addDiag(diag::BadStreamWithOrder, *with) << *dynamic;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch

    uint64_t targetWidth = lhs.getBitstreamWidth();
    uint64_t sourceWidth;
    bool good = true;

    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isFixedSize())
            return true; // Sizes checked at constant evaluation or runtime

        sourceWidth = rhs.type->getBitstreamWidth();
        good = targetWidth <= sourceWidth;
    }
    else {
        auto& source = rhs.as<StreamingConcatenationExpression>();
        sourceWidth = source.getBitstreamWidth();
        if (lhs.isFixedSize() && source.isFixedSize())
            good = targetWidth == sourceWidth;
        else
            good = dynamicSizesMatch(lhs, source);
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignmentRange);
        if (rhs.kind != ExpressionKind::Streaming)
            diag << targetWidth << sourceWidth;
        else {
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill)
                 << formatWidth(rhs.as<StreamingConcatenationExpression>(),
                                BitstreamSizeMode::Source);
        }

        diag << lhs.sourceRange;
        if (rhs.kind == ExpressionKind::Streaming)
            diag << rhs.sourceRange;
    }

    return good;
}